

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O1

time_t Convert(time_t Month,time_t Day,time_t Year,time_t Hours,time_t Minutes,time_t Seconds,
              time_t Timezone,DSTMODE DSTmode)

{
  long lVar1;
  tm *ptVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar14;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  time_t local_10;
  
  uVar5 = Year + 0x76c;
  if (99 < Year) {
    uVar5 = Year;
  }
  if (Year < 0x45) {
    uVar5 = Year + 2000;
  }
  Convert::DaysInMonth[1] = 0x1c;
  if ((uVar5 & 3) == 0) {
    lVar1 = uVar5 * -0x70a3d70a3d70a3d7;
    Convert::DaysInMonth[1] = 0x1d;
    if ((lVar1 + 0x51eb851eb851eb8U >> 2 | lVar1 << 0x3e) < 0x28f5c28f5c28f5d) {
      Convert::DaysInMonth[1] =
           ((lVar1 + 0x51eb851eb851eb0U >> 4 | lVar1 << 0x3c) < 0xa3d70a3d70a3d7) + 0x1c;
    }
  }
  local_10 = -1;
  if (((((0 < Day) && (0xfffffffffffffff3 < Month - 0xdU)) && (0xffffffffffffffba < uVar5 - 0x7f7))
      && (((ulong)Seconds < 0x3c && ((ulong)Minutes < 0x3c)))) && ((ulong)Hours < 0x18)) {
    uVar3 = Month - 1;
    piVar6 = Convert::DaysInMonth;
    if (Day <= Convert::DaysInMonth[uVar3 & 0xffffffff]) {
      uVar4 = Day - 1;
      if (1 < Month) {
        do {
          uVar4 = uVar4 + (long)*piVar6;
          piVar6 = piVar6 + 1;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      if (0x7b2 < (long)uVar5) {
        lVar1 = uVar5 - 0x7b3;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar4;
        auVar9._8_4_ = (int)lVar1;
        auVar9._0_8_ = lVar1;
        auVar9._12_4_ = (int)((ulong)lVar1 >> 0x20);
        lVar1 = 2;
        auVar12 = _DAT_00165340;
        do {
          auVar8 = auVar7;
          auVar7 = auVar12 & _DAT_00165350;
          auVar20._0_4_ = -(uint)(auVar7._0_4_ == 0);
          auVar20._4_4_ = -(uint)(auVar7._4_4_ == 0);
          auVar20._8_4_ = -(uint)(auVar7._8_4_ == 0);
          auVar20._12_4_ = -(uint)(auVar7._12_4_ == 0);
          auVar21._4_4_ = auVar20._0_4_;
          auVar21._0_4_ = auVar20._4_4_;
          auVar21._8_4_ = auVar20._12_4_;
          auVar21._12_4_ = auVar20._8_4_;
          auVar7._0_8_ = (auVar8._0_8_ - SUB168(auVar21 & auVar20,0)) + 0x16d;
          auVar7._8_8_ = (auVar8._8_8_ - SUB168(auVar21 & auVar20,8)) + 0x16d;
          lVar14 = auVar12._8_8_;
          auVar12._0_8_ = auVar12._0_8_ + 2;
          auVar12._8_8_ = lVar14 + 2;
          lVar14 = (uVar5 - 0x7b1 & 0xfffffffffffffffe) + lVar1;
          lVar1 = lVar1 + -2;
        } while (lVar14 != 4);
        lVar1 = -lVar1;
        auVar11._8_4_ = (int)lVar1;
        auVar11._0_8_ = lVar1;
        auVar11._12_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar9 = auVar9 ^ _DAT_00165390;
        auVar12 = (auVar11 | _DAT_00165380) ^ _DAT_00165390;
        iVar15 = -(uint)(auVar9._0_4_ < auVar12._0_4_);
        iVar16 = -(uint)(auVar9._4_4_ < auVar12._4_4_);
        iVar17 = -(uint)(auVar9._8_4_ < auVar12._8_4_);
        iVar18 = -(uint)(auVar9._12_4_ < auVar12._12_4_);
        auVar19._4_4_ = iVar15;
        auVar19._0_4_ = iVar15;
        auVar19._8_4_ = iVar17;
        auVar19._12_4_ = iVar17;
        iVar15 = -(uint)(auVar12._4_4_ == auVar9._4_4_);
        iVar17 = -(uint)(auVar12._12_4_ == auVar9._12_4_);
        auVar10._4_4_ = iVar15;
        auVar10._0_4_ = iVar15;
        auVar10._8_4_ = iVar17;
        auVar10._12_4_ = iVar17;
        auVar13._4_4_ = iVar16;
        auVar13._0_4_ = iVar16;
        auVar13._8_4_ = iVar18;
        auVar13._12_4_ = iVar18;
        auVar13 = auVar13 | auVar10 & auVar19;
        auVar7 = ~auVar13 & auVar7 | auVar8 & auVar13;
        uVar4 = auVar7._8_8_ + auVar7._0_8_;
      }
      local_10 = Minutes * 0x3c + Hours * 0xe10 + Seconds + Timezone + uVar4 * 0x15180;
      if ((DSTmode == DSTon) ||
         ((DSTmode == DSTmaybe && (ptVar2 = localtime(&local_10), ptVar2->tm_isdst != 0)))) {
        local_10 = local_10 + -0xe10;
      }
    }
  }
  return local_10;
}

Assistant:

static time_t
Convert(time_t Month, time_t Day, time_t Year,
	time_t Hours, time_t Minutes, time_t Seconds,
	time_t Timezone, enum DSTMODE DSTmode)
{
	static int DaysInMonth[12] = {
		31, 0, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31
	};
	time_t	Julian;
	int	i;

	if (Year < 69)
		Year += 2000;
	else if (Year < 100)
		Year += 1900;
	DaysInMonth[1] = Year % 4 == 0 && (Year % 100 != 0 || Year % 400 == 0)
	    ? 29 : 28;
	/* Checking for 2038 bogusly assumes that time_t is 32 bits.  But
	   I'm too lazy to try to check for time_t overflow in another way.  */
	if (Year < EPOCH || Year > 2038
	    || Month < 1 || Month > 12
	    /* Lint fluff:  "conversion from long may lose accuracy" */
	    || Day < 1 || Day > DaysInMonth[(int)--Month]
	    || Hours < 0 || Hours > 23
	    || Minutes < 0 || Minutes > 59
	    || Seconds < 0 || Seconds > 59)
		return -1;

	Julian = Day - 1;
	for (i = 0; i < Month; i++)
		Julian += DaysInMonth[i];
	for (i = EPOCH; i < Year; i++)
		Julian += 365 + (i % 4 == 0);
	Julian *= DAY;
	Julian += Timezone;
	Julian += Hours * HOUR + Minutes * MINUTE + Seconds;
	if (DSTmode == DSTon
	    || (DSTmode == DSTmaybe && localtime(&Julian)->tm_isdst))
		Julian -= HOUR;
	return Julian;
}